

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control.h
# Opt level: O2

string * ipx::Textline<char[26]>(string *__return_storage_ptr__,char (*text) [26])

{
  ostringstream s;
  undefined1 local_190 [24];
  uint auStack_178 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::operator<<((ostream *)local_190,"    ");
  *(uint *)(local_190 + 0x18 + (long)*(_func_int **)(local_190._0_8_ + -0x18)) =
       *(uint *)(local_190 + 0x18 + (long)*(_func_int **)(local_190._0_8_ + -0x18)) | 0x20;
  *(undefined8 *)(*(_func_int **)(local_190._0_8_ + -0x18) + (long)(local_190 + 0x10)) = 0x34;
  std::operator<<((ostream *)local_190,*text);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string Textline(const T& text) {
    std::ostringstream s;
    s << "    ";
    s.setf(std::ios_base::left);
    s.width(52);
    s << text;
    return s.str();
}